

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

bool testing::Test::HasFatalFailure(void)

{
  bool bVar1;
  UnitTestImpl *this;
  
  this = internal::GetUnitTestImpl();
  internal::UnitTestImpl::current_test_result(this);
  bVar1 = TestResult::HasFatalFailure((TestResult *)0x138bb6);
  return bVar1;
}

Assistant:

bool Test::HasFatalFailure() {
  return internal::GetUnitTestImpl()->current_test_result()->HasFatalFailure();
}